

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O1

int32_t parse_init_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  FILE *pFVar1;
  Btor2Line *pBVar2;
  int32_t iVar3;
  int64_t absid;
  void *__s;
  Btor2Parser *__ptr;
  int64_t absid_1;
  Btor2Line *pBVar4;
  FILE *pFVar5;
  Btor2Parser *pBVar6;
  char *pcVar7;
  Btor2Line *l_00;
  Btor2Parser *pBVar8;
  char *pcVar9;
  Btor2Parser *__ptr_00;
  long lVar10;
  ulong uVar11;
  
  iVar3 = parse_sort_id_bfr(bfr,&l->sort);
  if ((iVar3 != 0) && (iVar3 = parse_args(bfr,l,2), iVar3 != 0)) {
    lVar10 = *l->args;
    if (lVar10 < 0) {
      pcVar7 = "invalid negated first argument";
    }
    else {
      if ((lVar10 == 0) || (bfr->ntable <= lVar10)) {
        pBVar4 = (Btor2Line *)0x0;
      }
      else {
        pBVar4 = bfr->table[lVar10];
      }
      if (pBVar4->tag == BTOR2_TAG_state) {
        pcVar7 = (char *)l->args[1];
        pcVar9 = (char *)-(long)pcVar7;
        if (0 < (long)pcVar7) {
          pcVar9 = pcVar7;
        }
        if ((long)pcVar9 <= lVar10) {
          __s = btor2parser_malloc((size_t)(pcVar9 + 1));
          l_00 = (Btor2Line *)0x0;
          memset(__s,0,(size_t)(pcVar9 + 1));
          pBVar8 = (Btor2Parser *)0x8;
          __ptr = (Btor2Parser *)malloc(8);
          if (__ptr == (Btor2Parser *)0x0) {
LAB_0010377c:
            parse_init_bfr_cold_2();
            iVar3 = parse_sort_id_bfr(pBVar8,&l_00->sort);
            if (iVar3 == 0) {
              return 0;
            }
            iVar3 = parse_args(pBVar8,l_00,3);
            return iVar3;
          }
          pBVar8 = (Btor2Parser *)&__ptr->table;
          __ptr->error = pcVar7;
          pBVar6 = pBVar8;
          do {
            pFVar1 = pBVar6[-1].file;
            pBVar6 = (Btor2Parser *)&pBVar6[-1].file;
            pFVar5 = (FILE *)-(long)pFVar1;
            if (0 < (long)pFVar1) {
              pFVar5 = pFVar1;
            }
            if (*(char *)((long)__s + (long)pFVar5) == '\0') {
              *(undefined1 *)((long)__s + (long)pFVar5) = 1;
              pBVar2 = bfr->table[(long)pFVar5];
              if (pBVar2->tag == BTOR2_TAG_input) {
                perr_bfr(bfr,
                         "inputs are not allowed in initialization expressions, use a state instead of input %ld."
                        );
                free(__s);
                free(__ptr);
                return 0;
              }
              if (pBVar2->nargs != 0) {
                uVar11 = 0;
                __ptr_00 = __ptr;
                do {
                  __ptr = __ptr_00;
                  if (pBVar6 == pBVar8) {
                    lVar10 = (long)pBVar8 - (long)__ptr_00 >> 2;
                    if (pBVar8 == __ptr_00) {
                      lVar10 = 1;
                    }
                    l_00 = (Btor2Line *)(lVar10 * 8);
                    pBVar8 = __ptr_00;
                    __ptr = (Btor2Parser *)realloc(__ptr_00,(size_t)l_00);
                    if (__ptr == (Btor2Parser *)0x0) {
                      parse_init_bfr_cold_1();
                      goto LAB_0010377c;
                    }
                    pBVar6 = (Btor2Parser *)(((long)pBVar6 - (long)__ptr_00) + (long)__ptr);
                    pBVar8 = (Btor2Parser *)(&__ptr->error + lVar10);
                  }
                  pBVar6->error = (char *)pBVar2->args[uVar11];
                  pBVar6 = (Btor2Parser *)&pBVar6->table;
                  uVar11 = uVar11 + 1;
                  __ptr_00 = __ptr;
                } while (uVar11 < pBVar2->nargs);
              }
            }
            if (pBVar6 == __ptr) {
              free(__s);
              free(__ptr);
              if (pBVar4->init != 0) {
                perr_bfr(bfr,"state %ld initialized twice",pBVar4->id);
                return 0;
              }
              pBVar4->init = l->args[1];
              return 1;
            }
          } while( true );
        }
        pcVar7 = "state id must be greater than id of second operand";
      }
      else {
        pcVar7 = "expected state as first argument";
      }
    }
    perr_bfr(bfr,pcVar7);
  }
  return 0;
}

Assistant:

static int32_t
parse_init_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  Btor2Line *state;
  if (!parse_sort_id_bfr (bfr, &l->sort)) return 0;
  if (!parse_args (bfr, l, 2)) return 0;
  if (l->args[0] < 0) return perr_bfr (bfr, "invalid negated first argument");
  state = id2line_bfr (bfr, l->args[0]);
  if (state->tag != BTOR2_TAG_state)
    return perr_bfr (bfr, "expected state as first argument");
  if (l->args[0] < labs (l->args[1]))
    return perr_bfr (bfr, "state id must be greater than id of second operand");
  if (!check_state_init (bfr, l->args[0], l->args[1])) return 0;
  if (state->init)
    return perr_bfr (bfr, "state %" PRId64 " initialized twice", state->id);
  state->init = l->args[1];
  return 1;
}